

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O2

void jinit_c_master_control(j_compress_ptr cinfo,boolean transcode_only)

{
  jpeg_scan_info *pjVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  jpeg_error_mgr *pjVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  jpeg_comp_master *pjVar10;
  long lVar11;
  uint *puVar12;
  int iVar13;
  int *piVar14;
  ulong uVar15;
  int iVar16;
  jpeg_scan_info *pjVar17;
  int iVar18;
  int iVar19;
  jpeg_scan_info *pjVar20;
  long lVar21;
  jpeg_component_info *pjVar22;
  ulong uVar23;
  boolean component_sent [10];
  uint local_a38 [642];
  
  pjVar10 = (jpeg_comp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x30);
  cinfo->master = pjVar10;
  pjVar10->prepare_for_pass = prepare_for_pass;
  pjVar10->pass_startup = pass_startup;
  pjVar10->finish_pass = finish_pass_master;
  pjVar10->is_last_pass = 0;
  if (transcode_only == 0) {
    jpeg_calc_jpeg_dimensions(cinfo);
    iVar19 = cinfo->block_size;
  }
  else {
    iVar19 = cinfo->min_DCT_h_scaled_size;
    if (iVar19 != cinfo->min_DCT_v_scaled_size) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 7;
      (pjVar5->msg_parm).i[0] = iVar19;
      (cinfo->err->msg_parm).i[1] = cinfo->min_DCT_v_scaled_size;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      iVar19 = cinfo->min_DCT_h_scaled_size;
    }
    cinfo->block_size = iVar19;
  }
  if (iVar19 - 0x11U < 0xfffffff0) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 7;
    (pjVar5->msg_parm).i[0] = iVar19;
    (cinfo->err->msg_parm).i[1] = cinfo->block_size;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    iVar19 = cinfo->block_size;
  }
  if (iVar19 - 2U < 6) {
    piVar14 = (int *)(&PTR_jpeg_natural_order2_0021e900)[iVar19 - 2U];
  }
  else {
    piVar14 = jpeg_natural_order;
  }
  iVar8 = 0x3f;
  if (iVar19 < 8) {
    iVar8 = iVar19 * iVar19 + -1;
  }
  cinfo->natural_order = piVar14;
  cinfo->lim_Se = iVar8;
  uVar9 = cinfo->jpeg_height;
  if ((((uVar9 == 0) || (cinfo->jpeg_width == 0)) || (cinfo->num_components < 1)) ||
     (cinfo->input_components < 1)) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x21;
    (*pjVar5->error_exit)((j_common_ptr)cinfo);
    uVar9 = cinfo->jpeg_height;
  }
  if ((0xffdc < uVar9) || (0xffdc < cinfo->jpeg_width)) {
    *(undefined8 *)&cinfo->err->msg_code = 0xffdc0000002a;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if ((long)cinfo->input_components * (ulong)cinfo->image_width >> 0x20 != 0) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x48;
    (*pjVar5->error_exit)((j_common_ptr)cinfo);
  }
  iVar19 = cinfo->data_precision;
  if (iVar19 != 8) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x10;
    (pjVar5->msg_parm).i[0] = iVar19;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar19 = cinfo->num_components;
  if (10 < iVar19) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x1b;
    (pjVar5->msg_parm).i[0] = iVar19;
    (cinfo->err->msg_parm).i[1] = 10;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  cinfo->max_h_samp_factor = 1;
  cinfo->max_v_samp_factor = 1;
  piVar14 = &cinfo->comp_info->v_samp_factor;
  iVar19 = 1;
  iVar8 = 1;
  for (iVar16 = 0; iVar13 = cinfo->num_components, iVar16 < iVar13; iVar16 = iVar16 + 1) {
    iVar13 = piVar14[-1];
    if ((iVar13 - 5U < 0xfffffffc) || (iVar18 = *piVar14, iVar18 - 5U < 0xfffffffc)) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 0x13;
      (*pjVar5->error_exit)((j_common_ptr)cinfo);
      iVar19 = cinfo->max_h_samp_factor;
      iVar8 = cinfo->max_v_samp_factor;
      iVar13 = piVar14[-1];
      iVar18 = *piVar14;
    }
    if (iVar13 < iVar19) {
      iVar13 = iVar19;
    }
    cinfo->max_h_samp_factor = iVar13;
    if (iVar18 < iVar8) {
      iVar18 = iVar8;
    }
    cinfo->max_v_samp_factor = iVar18;
    piVar14 = piVar14 + 0x18;
    iVar19 = iVar13;
    iVar8 = iVar18;
  }
  pjVar22 = cinfo->comp_info;
  for (iVar19 = 0; iVar19 < iVar13; iVar19 = iVar19 + 1) {
    pjVar22->component_index = iVar19;
    iVar16 = (uint)(cinfo->do_fancy_downsampling != 0) * 4 + 4;
    iVar8 = 1;
    do {
      iVar13 = iVar8 * cinfo->min_DCT_h_scaled_size;
      if (iVar16 < iVar13) break;
      iVar8 = iVar8 * 2;
    } while (cinfo->max_h_samp_factor % (pjVar22->h_samp_factor * iVar8) == 0);
    pjVar22->DCT_h_scaled_size = iVar13;
    iVar8 = 1;
    do {
      iVar18 = iVar8 * cinfo->min_DCT_v_scaled_size;
      if (iVar16 < iVar18) break;
      iVar8 = iVar8 * 2;
    } while (cinfo->max_v_samp_factor % (pjVar22->v_samp_factor * iVar8) == 0);
    pjVar22->DCT_v_scaled_size = iVar18;
    iVar8 = iVar18 * 2;
    if (iVar13 == iVar8 || SBORROW4(iVar13,iVar8) != iVar13 + iVar18 * -2 < 0) {
      if (iVar13 * 2 < iVar18) {
        pjVar22->DCT_v_scaled_size = iVar13 * 2;
      }
    }
    else {
      pjVar22->DCT_h_scaled_size = iVar8;
    }
    lVar11 = jdiv_round_up((long)pjVar22->h_samp_factor * (ulong)cinfo->jpeg_width,
                           (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
    pjVar22->width_in_blocks = (JDIMENSION)lVar11;
    lVar11 = jdiv_round_up((long)pjVar22->v_samp_factor * (ulong)cinfo->jpeg_height,
                           (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
    pjVar22->height_in_blocks = (JDIMENSION)lVar11;
    lVar11 = jdiv_round_up((long)pjVar22->DCT_h_scaled_size * (long)pjVar22->h_samp_factor *
                           (ulong)cinfo->jpeg_width,
                           (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
    pjVar22->downsampled_width = (JDIMENSION)lVar11;
    lVar11 = jdiv_round_up((long)pjVar22->DCT_v_scaled_size * (long)pjVar22->v_samp_factor *
                           (ulong)cinfo->jpeg_height,
                           (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
    pjVar22->downsampled_height = (JDIMENSION)lVar11;
    pjVar22->component_needed = 1;
    pjVar22 = pjVar22 + 1;
    iVar13 = cinfo->num_components;
  }
  lVar11 = jdiv_round_up((ulong)cinfo->jpeg_height,
                         (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
  cinfo->total_iMCU_rows = (JDIMENSION)lVar11;
  pjVar20 = cinfo->scan_info;
  if (pjVar20 == (jpeg_scan_info *)0x0) {
    cinfo->progressive_mode = 0;
    uVar9 = 1;
LAB_001c1e84:
    cinfo->num_scans = uVar9;
  }
  else {
    if (cinfo->num_scans < 1) {
      *(undefined8 *)&cinfo->err->msg_code = 0x14;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      pjVar20 = cinfo->scan_info;
    }
    if ((pjVar20->Ss == 0) && (pjVar20->Se == 0x3f)) {
      cinfo->progressive_mode = 0;
      uVar15 = 0;
      uVar23 = (ulong)(uint)cinfo->num_components;
      if (cinfo->num_components < 1) {
        uVar23 = uVar15;
      }
      for (; uVar23 != uVar15; uVar15 = uVar15 + 1) {
        component_sent[uVar15] = 0;
      }
    }
    else {
      cinfo->progressive_mode = 1;
      puVar12 = local_a38;
      for (iVar19 = 0; iVar19 < cinfo->num_components; iVar19 = iVar19 + 1) {
        for (lVar11 = 0; (int)lVar11 != 0x100; lVar11 = lVar11 + 4) {
          *(undefined4 *)((long)puVar12 + lVar11) = 0xffffffff;
        }
        puVar12 = (uint *)((long)puVar12 + lVar11);
      }
    }
    for (iVar19 = 1; iVar19 <= cinfo->num_scans; iVar19 = iVar19 + 1) {
      uVar9 = pjVar20->comps_in_scan;
      if (uVar9 - 5 < 0xfffffffc) {
        pjVar5 = cinfo->err;
        pjVar5->msg_code = 0x1b;
        (pjVar5->msg_parm).i[0] = uVar9;
        (cinfo->err->msg_parm).i[1] = 4;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      uVar23 = 0;
      if (0 < (int)uVar9) {
        uVar23 = (ulong)uVar9;
      }
      for (uVar15 = 0; uVar23 != uVar15; uVar15 = uVar15 + 1) {
        iVar8 = pjVar20->component_index[uVar15];
        if ((iVar8 < 0) || (cinfo->num_components <= iVar8)) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x14;
          (pjVar5->msg_parm).i[0] = iVar19;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if ((uVar15 != 0) && (iVar8 <= pjVar20->component_index[uVar15 - 1])) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x14;
          (pjVar5->msg_parm).i[0] = iVar19;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
      }
      uVar2 = pjVar20->Ss;
      lVar11 = (long)(int)uVar2;
      iVar8 = pjVar20->Se;
      uVar3 = pjVar20->Ah;
      uVar4 = pjVar20->Al;
      if (cinfo->progressive_mode == 0) {
        if ((((uVar2 != 0) || (iVar8 != 0x3f)) || (uVar3 != 0)) || (uVar4 != 0)) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x12;
          (pjVar5->msg_parm).i[0] = iVar19;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        for (uVar15 = 0; uVar23 != uVar15; uVar15 = uVar15 + 1) {
          iVar8 = pjVar20->component_index[uVar15];
          if (component_sent[iVar8] != 0) {
            pjVar5 = cinfo->err;
            pjVar5->msg_code = 0x14;
            (pjVar5->msg_parm).i[0] = iVar19;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          component_sent[iVar8] = 1;
        }
      }
      else {
        if (((0x3f < uVar2) || (iVar8 < (int)uVar2)) ||
           ((0x3f < iVar8 || ((10 < uVar3 || (10 < uVar4)))))) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x12;
          (pjVar5->msg_parm).i[0] = iVar19;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if (uVar2 == 0) {
          if (iVar8 != 0) goto LAB_001c1d56;
        }
        else if (uVar9 != 1) {
LAB_001c1d56:
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x12;
          (pjVar5->msg_parm).i[0] = iVar19;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        for (uVar15 = 0; uVar15 != uVar23; uVar15 = uVar15 + 1) {
          puVar12 = local_a38 + (long)pjVar20->component_index[uVar15] * 0x40;
          lVar21 = lVar11;
          if ((uVar2 != 0) && ((int)*puVar12 < 0)) {
            pjVar5 = cinfo->err;
            pjVar5->msg_code = 0x12;
            (pjVar5->msg_parm).i[0] = iVar19;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          for (; lVar21 <= iVar8; lVar21 = lVar21 + 1) {
            if ((int)puVar12[lVar21] < 0) {
              if (uVar3 != 0) goto LAB_001c1dda;
            }
            else if (puVar12[lVar21] != uVar3 || uVar3 - 1 != uVar4) {
LAB_001c1dda:
              pjVar5 = cinfo->err;
              pjVar5->msg_code = 0x12;
              (pjVar5->msg_parm).i[0] = iVar19;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            puVar12[lVar21] = uVar4;
          }
        }
      }
      pjVar20 = pjVar20 + 1;
    }
    if (cinfo->progressive_mode == 0) {
      for (lVar11 = 0; lVar11 < cinfo->num_components; lVar11 = lVar11 + 1) {
        if (component_sent[lVar11] == 0) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x2e;
          (*pjVar5->error_exit)((j_common_ptr)cinfo);
        }
      }
    }
    else {
      puVar12 = local_a38;
      for (lVar11 = 0; lVar11 < cinfo->num_components; lVar11 = lVar11 + 1) {
        if ((int)*puVar12 < 0) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x2e;
          (*pjVar5->error_exit)((j_common_ptr)cinfo);
        }
        puVar12 = puVar12 + 0x40;
      }
    }
    if (cinfo->block_size < 8) {
      pjVar20 = cinfo->scan_info;
      uVar9 = 0;
      pjVar17 = pjVar20;
      for (uVar23 = 0; (long)uVar23 < (long)cinfo->num_scans; uVar23 = uVar23 + 1) {
        if (uVar23 != uVar9) {
          pjVar20[(int)uVar9].Al = pjVar17->Al;
          iVar19 = pjVar17->comps_in_scan;
          iVar8 = pjVar17->component_index[0];
          uVar6 = *(undefined8 *)(pjVar17->component_index + 1);
          uVar7 = *(undefined8 *)&pjVar17->Se;
          *(undefined8 *)(pjVar20[(int)uVar9].component_index + 3) =
               *(undefined8 *)(pjVar17->component_index + 3);
          *(undefined8 *)(pjVar20[(int)uVar9].component_index + 3 + 2) = uVar7;
          pjVar1 = pjVar20 + (int)uVar9;
          pjVar1->comps_in_scan = iVar19;
          pjVar1->component_index[0] = iVar8;
          *(undefined8 *)(pjVar1->component_index + 1) = uVar6;
        }
        iVar19 = cinfo->lim_Se;
        if (pjVar20[(int)uVar9].Ss <= iVar19) {
          if (iVar19 < pjVar20[(int)uVar9].Se) {
            pjVar20[(int)uVar9].Se = iVar19;
          }
          uVar9 = uVar9 + 1;
        }
        pjVar17 = pjVar17 + 1;
      }
      goto LAB_001c1e84;
    }
  }
  if (((cinfo->progressive_mode != 0) || (cinfo->block_size < 8)) && (cinfo->arith_code == 0)) {
    cinfo->optimize_coding = 1;
  }
  if (transcode_only == 0) {
    *(undefined4 *)&pjVar10[1].prepare_for_pass = 0;
    iVar19 = cinfo->optimize_coding;
    *(undefined4 *)((long)&pjVar10[1].pass_startup + 4) = 0;
    *(undefined4 *)((long)&pjVar10[1].prepare_for_pass + 4) = 0;
    if (iVar19 == 0) goto LAB_001c1fbb;
  }
  else {
    if (cinfo->optimize_coding == 0) {
      pjVar10[1].prepare_for_pass = (_func_void_j_compress_ptr *)0x2;
      *(undefined4 *)((long)&pjVar10[1].pass_startup + 4) = 0;
LAB_001c1fbb:
      iVar19 = cinfo->num_scans;
      goto LAB_001c1fc2;
    }
    pjVar10[1].prepare_for_pass = (_func_void_j_compress_ptr *)0x1;
    *(undefined4 *)((long)&pjVar10[1].pass_startup + 4) = 0;
  }
  iVar19 = cinfo->num_scans * 2;
LAB_001c1fc2:
  *(int *)&pjVar10[1].pass_startup = iVar19;
  return;
}

Assistant:

GLOBAL(void)
jinit_c_master_control (j_compress_ptr cinfo, boolean transcode_only)
{
  my_master_ptr master;

  master = (my_master_ptr)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(my_comp_master));
  cinfo->master = (struct jpeg_comp_master *) master;
  master->pub.prepare_for_pass = prepare_for_pass;
  master->pub.pass_startup = pass_startup;
  master->pub.finish_pass = finish_pass_master;
  master->pub.is_last_pass = FALSE;

  /* Validate parameters, determine derived values */
  initial_setup(cinfo, transcode_only);

  if (cinfo->scan_info != NULL) {
#ifdef C_MULTISCAN_FILES_SUPPORTED
    validate_script(cinfo);
    if (cinfo->block_size < DCTSIZE)
      reduce_script(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    cinfo->progressive_mode = FALSE;
    cinfo->num_scans = 1;
  }

  if ((cinfo->progressive_mode || cinfo->block_size < DCTSIZE) &&
      !cinfo->arith_code)			/*  TEMPORARY HACK ??? */
    /* assume default tables no good for progressive or downscale mode */
    cinfo->optimize_coding = TRUE;

  /* Initialize my private state */
  if (transcode_only) {
    /* no main pass in transcoding */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    else
      master->pass_type = output_pass;
  } else {
    /* for normal compression, first pass is always this type: */
    master->pass_type = main_pass;
  }
  master->scan_number = 0;
  master->pass_number = 0;
  if (cinfo->optimize_coding)
    master->total_passes = cinfo->num_scans * 2;
  else
    master->total_passes = cinfo->num_scans;
}